

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::LoadCachedHeapArguments(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  RegSlot R0;
  Symbol *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  OpCode op;
  
  if ((funcInfo->field_0xb4 & 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x242,"(funcInfo->GetHasHeapArguments())","funcInfo->GetHasHeapArguments()")
    ;
    if (!bVar2) goto LAB_0080746d;
    *puVar3 = 0;
  }
  if (funcInfo->bodyScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x245,"(scope)","scope");
    if (!bVar2) goto LAB_0080746d;
    *puVar3 = 0;
  }
  this_00 = funcInfo->argumentsSymbol;
  if (this_00 != (Symbol *)0x0) {
    bVar2 = Symbol::IsArguments(this_00);
    if (bVar2) goto LAB_00807428;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                     ,0x247,"(argSym && argSym->IsArguments())","argSym && argSym->IsArguments()");
  if (!bVar2) {
LAB_0080746d:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00807428:
  R0 = this_00->location;
  op = LdLetHeapArgsCached;
  if (-1 < (short)funcInfo->root->fncFlags) {
    op = LdHeapArgsCached;
  }
  Js::ByteCodeWriter::Reg1(&this->m_writer,op,R0);
  EmitLocalPropInit(this,R0,this_00,funcInfo);
  return;
}

Assistant:

void ByteCodeGenerator::LoadCachedHeapArguments(FuncInfo *funcInfo)
{
    Assert(funcInfo->GetHasHeapArguments());

    Scope *scope = funcInfo->GetBodyScope();
    Assert(scope);
    Symbol *argSym = funcInfo->GetArgumentsSymbol();
    Assert(argSym && argSym->IsArguments());
    Js::RegSlot argumentsLoc = argSym->GetLocation();

    Js::OpCode op = !funcInfo->root->HasNonSimpleParameterList() ? Js::OpCode::LdHeapArgsCached : Js::OpCode::LdLetHeapArgsCached;

    this->m_writer.Reg1(op, argumentsLoc);
    EmitLocalPropInit(argumentsLoc, argSym, funcInfo);
}